

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbTest.c
# Opt level: O3

Gia_Man_t * Acb_NtkGiaDeriveMiter(Gia_Man_t *pOne,Gia_Man_t *pTwo,int Type)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  int *piVar6;
  int iVar7;
  Gia_Man_t *p;
  char *pcVar8;
  Gia_Obj_t *pGVar9;
  Vec_Int_t *pVVar10;
  Gia_Man_t *pGVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  int pLitsS [2];
  int pLitsF [2];
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  if (pOne->vCis->nSize != pTwo->vCis->nSize) {
    __assert_fail("Gia_ManCiNum(pOne) == Gia_ManCiNum(pTwo)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbTest.c"
                  ,400,"Gia_Man_t *Acb_NtkGiaDeriveMiter(Gia_Man_t *, Gia_Man_t *, int)");
  }
  iVar7 = pOne->vCos->nSize;
  if (iVar7 != pTwo->vCos->nSize) {
    __assert_fail("Gia_ManCoNum(pOne) == Gia_ManCoNum(pTwo)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbTest.c"
                  ,0x191,"Gia_Man_t *Acb_NtkGiaDeriveMiter(Gia_Man_t *, Gia_Man_t *, int)");
  }
  p = Gia_ManStart((iVar7 * 5) / 2 + pOne->nObjs + pTwo->nObjs);
  pcVar8 = (char *)malloc(6);
  builtin_strncpy(pcVar8,"miter",6);
  p->pName = pcVar8;
  p->pSpec = (char *)0x0;
  Gia_ManHashAlloc(p);
  pOne->pObjs->Value = 0;
  pTwo->pObjs->Value = 0;
  pVVar10 = pOne->vCis;
  uVar12 = pVVar10->nSize;
  uVar13 = (ulong)uVar12;
  if (0 < (int)uVar12) {
    lVar16 = 0;
    do {
      uVar12 = (uint)uVar13;
      iVar7 = pVVar10->pArray[lVar16];
      if (((long)iVar7 < 0) || (pOne->nObjs <= iVar7)) goto LAB_003adb14;
      pGVar4 = pOne->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      pGVar9 = Gia_ManAppendObj(p);
      uVar13 = *(ulong *)pGVar9;
      *(ulong *)pGVar9 = uVar13 | 0x9fffffff;
      *(ulong *)pGVar9 =
           uVar13 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar5 = p->pObjs;
      if ((pGVar9 < pGVar5) || (pGVar5 + p->nObjs <= pGVar9)) {
LAB_003adb52:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar5) >> 2) * -0x55555555);
      pGVar5 = p->pObjs;
      if ((pGVar9 < pGVar5) || (pGVar5 + p->nObjs <= pGVar9)) goto LAB_003adb52;
      pGVar4[iVar7].Value = (int)((ulong)((long)pGVar9 - (long)pGVar5) >> 2) * 0x55555556;
      lVar16 = lVar16 + 1;
      pVVar10 = pOne->vCis;
      uVar12 = pVVar10->nSize;
      uVar13 = (ulong)(int)uVar12;
    } while (lVar16 < (long)uVar13);
  }
  uVar13 = (ulong)pTwo->vCis->nSize;
  if (0 < (long)uVar13) {
    piVar6 = pTwo->vCis->pArray;
    uVar14 = 0;
    uVar15 = (ulong)uVar12;
    if ((int)uVar12 < 1) {
      uVar15 = uVar14;
    }
    do {
      iVar7 = piVar6[uVar14];
      if (((long)iVar7 < 0) || (pTwo->nObjs <= iVar7)) goto LAB_003adb14;
      if (pTwo->pObjs == (Gia_Obj_t *)0x0) break;
      if (uVar15 == uVar14) goto LAB_003adb33;
      iVar1 = pVVar10->pArray[uVar14];
      if (((long)iVar1 < 0) || (pOne->nObjs <= iVar1)) goto LAB_003adb14;
      pTwo->pObjs[iVar7].Value = pOne->pObjs[iVar1].Value;
      uVar14 = uVar14 + 1;
    } while (uVar13 != uVar14);
  }
  iVar7 = pOne->nObjs;
  if (0 < iVar7) {
    lVar16 = 8;
    lVar17 = 0;
    do {
      pGVar4 = pOne->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar13 = *(ulong *)((long)pGVar4 + lVar16 + -8);
      if ((uVar13 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar13) {
        uVar12 = *(uint *)((long)pGVar4 +
                          lVar16 + (ulong)(uint)((int)(uVar13 & 0x1fffffff) << 2) * -3);
        if (((int)uVar12 < 0) ||
           (uVar2 = *(uint *)((long)pGVar4 +
                             lVar16 + (ulong)((uint)(uVar13 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar2 < 0)) goto LAB_003adb71;
        iVar7 = Gia_ManHashAnd(p,uVar12 ^ (uint)(uVar13 >> 0x1d) & 1,
                               uVar2 ^ (uint)(uVar13 >> 0x3d) & 1);
        *(int *)(&pGVar4->field_0x0 + lVar16) = iVar7;
        iVar7 = pOne->nObjs;
      }
      lVar17 = lVar17 + 1;
      lVar16 = lVar16 + 0xc;
    } while (lVar17 < iVar7);
  }
  iVar7 = pTwo->nObjs;
  if (0 < iVar7) {
    lVar16 = 8;
    lVar17 = 0;
    do {
      pGVar4 = pTwo->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar13 = *(ulong *)((long)pGVar4 + lVar16 + -8);
      if ((uVar13 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar13) {
        uVar12 = *(uint *)((long)pGVar4 +
                          lVar16 + (ulong)(uint)((int)(uVar13 & 0x1fffffff) << 2) * -3);
        if (((int)uVar12 < 0) ||
           (uVar2 = *(uint *)((long)pGVar4 +
                             lVar16 + (ulong)((uint)(uVar13 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar2 < 0)) goto LAB_003adb71;
        iVar7 = Gia_ManHashAnd(p,uVar12 ^ (uint)(uVar13 >> 0x1d) & 1,
                               uVar2 ^ (uint)(uVar13 >> 0x3d) & 1);
        *(int *)(&pGVar4->field_0x0 + lVar16) = iVar7;
        iVar7 = pTwo->nObjs;
      }
      lVar17 = lVar17 + 1;
      lVar16 = lVar16 + 0xc;
    } while (lVar17 < iVar7);
  }
  pVVar10 = pOne->vCos;
  iVar1 = pVVar10->nSize;
  uVar13 = (ulong)iVar1;
  if (0 < (long)uVar13) {
    piVar6 = pVVar10->pArray;
    uVar15 = 0;
    do {
      iVar3 = piVar6[uVar15];
      if (((long)iVar3 < 0) || (pOne->nObjs <= iVar3)) goto LAB_003adb14;
      if (pOne->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar4 = pOne->pObjs + iVar3;
      if ((int)pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value < 0)
      goto LAB_003adb71;
      pGVar4->Value =
           (uint)*(undefined8 *)pGVar4 >> 0x1d & 1 ^
           pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value;
      uVar15 = uVar15 + 1;
    } while (uVar13 != uVar15);
  }
  lVar16 = (long)pTwo->vCos->nSize;
  if (0 < lVar16) {
    piVar6 = pTwo->vCos->pArray;
    lVar17 = 0;
    do {
      iVar3 = piVar6[lVar17];
      if (((long)iVar3 < 0) || (iVar7 <= iVar3)) goto LAB_003adb14;
      if (pTwo->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar4 = pTwo->pObjs + iVar3;
      if ((int)pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value < 0) {
LAB_003adb71:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      pGVar4->Value =
           (uint)*(undefined8 *)pGVar4 >> 0x1d & 1 ^
           pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value;
      lVar17 = lVar17 + 1;
    } while (lVar16 != lVar17);
  }
  if (Type == 0) {
    if (0 < iVar1) {
      lVar16 = 0;
      do {
        iVar7 = pVVar10->pArray[lVar16];
        if (((long)iVar7 < 0) || (pOne->nObjs <= iVar7)) goto LAB_003adb14;
        if ((long)(int)uVar13 <= (long)(lVar16 + 1U)) goto LAB_003adb33;
        uVar12 = pVVar10->pArray[lVar16 + 1];
        if (((int)uVar12 < 0) || ((uint)pOne->nObjs <= uVar12)) goto LAB_003adb14;
        uVar12 = pTwo->vCos->nSize;
        if ((int)uVar12 <= lVar16) goto LAB_003adb33;
        piVar6 = pTwo->vCos->pArray;
        iVar1 = piVar6[lVar16];
        if (((long)iVar1 < 0) || (pTwo->nObjs <= iVar1)) goto LAB_003adb14;
        if ((ulong)uVar12 <= lVar16 + 1U) goto LAB_003adb33;
        uVar12 = piVar6[lVar16 + 1];
        if (((int)uVar12 < 0) || ((uint)pTwo->nObjs <= uVar12)) goto LAB_003adb14;
        uVar12 = pTwo->pObjs[iVar1].Value;
        Gia_ManAppendCo(p,pOne->pObjs[iVar7].Value);
        Gia_ManAppendCo(p,uVar12);
        lVar16 = lVar16 + 2;
        pVVar10 = pOne->vCos;
        uVar13 = (ulong)(uint)pVVar10->nSize;
      } while ((int)lVar16 < pVVar10->nSize);
    }
  }
  else if (Type == 1) {
    if (0 < iVar1) {
      lVar16 = 0;
      do {
        iVar7 = pVVar10->pArray[lVar16];
        if ((iVar7 < 0) || (pOne->nObjs <= iVar7)) {
LAB_003adb14:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if ((long)(int)uVar13 <= (long)(lVar16 + 1U)) {
LAB_003adb33:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar12 = pVVar10->pArray[lVar16 + 1];
        if (((long)(int)uVar12 < 0) || ((uint)pOne->nObjs <= uVar12)) goto LAB_003adb14;
        uVar2 = pTwo->vCos->nSize;
        if ((int)uVar2 <= lVar16) goto LAB_003adb33;
        piVar6 = pTwo->vCos->pArray;
        iVar7 = piVar6[lVar16];
        if ((iVar7 < 0) || (pTwo->nObjs <= iVar7)) goto LAB_003adb14;
        if ((ulong)uVar2 <= lVar16 + 1U) goto LAB_003adb33;
        uVar2 = piVar6[lVar16 + 1];
        if (((long)(int)uVar2 < 0) || ((uint)pTwo->nObjs <= uVar2)) goto LAB_003adb14;
        uVar2 = pTwo->pObjs[(int)uVar2].Value;
        Gia_ManAppendCo(p,pOne->pObjs[(int)uVar12].Value);
        Gia_ManAppendCo(p,uVar2);
        lVar16 = lVar16 + 2;
        pVVar10 = pOne->vCos;
        uVar13 = (ulong)(uint)pVVar10->nSize;
      } while ((int)lVar16 < pVVar10->nSize);
    }
  }
  else if (0 < iVar1) {
    lVar16 = 0;
    do {
      iVar7 = pVVar10->pArray[lVar16];
      if (((long)iVar7 < 0) || (pOne->nObjs <= iVar7)) goto LAB_003adb14;
      local_38 = pOne->pObjs[iVar7].Value;
      if ((long)(int)uVar13 <= (long)(lVar16 + 1U)) goto LAB_003adb33;
      uVar12 = pVVar10->pArray[lVar16 + 1];
      if (((long)(int)uVar12 < 0) || ((uint)pOne->nObjs <= uVar12)) goto LAB_003adb14;
      local_34 = pOne->pObjs[(int)uVar12].Value;
      uVar12 = pTwo->vCos->nSize;
      if ((int)uVar12 <= lVar16) goto LAB_003adb33;
      piVar6 = pTwo->vCos->pArray;
      iVar7 = piVar6[lVar16];
      if (((long)iVar7 < 0) || (pTwo->nObjs <= iVar7)) goto LAB_003adb14;
      local_40 = pTwo->pObjs[iVar7].Value;
      if ((ulong)uVar12 <= lVar16 + 1U) goto LAB_003adb33;
      uVar12 = piVar6[lVar16 + 1];
      if (((long)(int)uVar12 < 0) || ((uint)pTwo->nObjs <= uVar12)) goto LAB_003adb14;
      local_3c = pTwo->pObjs[(int)uVar12].Value;
      iVar7 = Gia_ManDualCompare(p,(int *)&local_38,(int *)&local_40);
      Gia_ManAppendCo(p,iVar7);
      lVar16 = lVar16 + 2;
      pVVar10 = pOne->vCos;
      uVar13 = (ulong)(uint)pVVar10->nSize;
    } while ((int)lVar16 < pVVar10->nSize);
  }
  Gia_ManHashStop(p);
  pGVar11 = Gia_ManCleanup(p);
  Gia_ManStop(p);
  return pGVar11;
}

Assistant:

Gia_Man_t * Acb_NtkGiaDeriveMiter( Gia_Man_t * pOne, Gia_Man_t * pTwo, int Type )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i;
    assert( Gia_ManCiNum(pOne) == Gia_ManCiNum(pTwo) );
    assert( Gia_ManCoNum(pOne) == Gia_ManCoNum(pTwo) );
    pNew = Gia_ManStart( Gia_ManObjNum(pOne) + Gia_ManObjNum(pTwo) + 5*Gia_ManCoNum(pOne)/2 );
    pNew->pName = Abc_UtilStrsav( "miter" );
    pNew->pSpec = NULL;
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(pOne)->Value = 0;
    Gia_ManConst0(pTwo)->Value = 0;
    Gia_ManForEachCi( pOne, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachCi( pTwo, pObj, i )
        pObj->Value = Gia_ManCi(pOne, i)->Value;
    Gia_ManForEachAnd( pOne, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachAnd( pTwo, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( pOne, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy(pObj);
    Gia_ManForEachCo( pTwo, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy(pObj);
    if ( Type == 0 ) // only main circuit
    {
        for ( i = 0; i < Gia_ManCoNum(pOne); i += 2 )
        {
            int pLitsF[2] = { Gia_ManCo(pOne, i)->Value, Gia_ManCo(pOne, i+1)->Value };
            int pLitsS[2] = { Gia_ManCo(pTwo, i)->Value, Gia_ManCo(pTwo, i+1)->Value };
            Gia_ManAppendCo( pNew, pLitsF[0] );
            Gia_ManAppendCo( pNew, pLitsS[0] );
        }
    }
    else if ( Type == 1 ) // only shadow circuit
    {
        for ( i = 0; i < Gia_ManCoNum(pOne); i += 2 )
        {
            int pLitsF[2] = { Gia_ManCo(pOne, i)->Value, Gia_ManCo(pOne, i+1)->Value };
            int pLitsS[2] = { Gia_ManCo(pTwo, i)->Value, Gia_ManCo(pTwo, i+1)->Value };
            Gia_ManAppendCo( pNew, pLitsF[1] );
            Gia_ManAppendCo( pNew, pLitsS[1] );
        }
    }
    else // comparator of the two
    {
        for ( i = 0; i < Gia_ManCoNum(pOne); i += 2 )
        {
            int pLitsF[2] = { Gia_ManCo(pOne, i)->Value, Gia_ManCo(pOne, i+1)->Value };
            int pLitsS[2] = { Gia_ManCo(pTwo, i)->Value, Gia_ManCo(pTwo, i+1)->Value };
            Gia_ManAppendCo( pNew, Gia_ManDualCompare( pNew, pLitsF, pLitsS ) );
        }
    }
    Gia_ManHashStop( pNew );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}